

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O3

void __thiscall merkle_tests::merkle_test_BlockWitness::test_method(merkle_test_BlockWitness *this)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  vector<uint256,_std::allocator<uint256>_> hashes_00;
  undefined1 auVar6 [16];
  base_blob<256U> *pbVar7;
  undefined1 auVar8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  iterator in_R8;
  iterator in_R9;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  const_string file;
  const_string msg;
  undefined8 in_stack_fffffffffffffe08;
  _func_int **in_stack_fffffffffffffe10;
  bool in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe19;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  vector<uint256,_std::allocator<uint256>_> local_1b0;
  vector<uint256,_std::allocator<uint256>_> hashes;
  CMutableTransaction mtx;
  uint256 *local_140;
  undefined1 local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  undefined1 *local_128;
  uint256 **local_120;
  undefined1 local_118 [8];
  char *local_110 [2];
  assertion_result local_100;
  uint256 merkleRootofHashes;
  uint256 blockWitness;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_11_ = SUB1611((undefined1  [16])0x0,5);
  local_58._0_8_ = (pointer)0x0;
  local_58._8_3_ = 0;
  local_58._11_5_ = 0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_58,2);
  if ((pointer)CONCAT53(local_58._11_5_,local_58._8_3_) != (pointer)local_58._0_8_) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      CMutableTransaction::CMutableTransaction(&mtx);
      mtx.nLockTime = (uint32_t)uVar11;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = _Stack_130._M_pi;
      _local_138 = auVar6 << 0x40;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
                 (CTransaction **)local_138,(allocator<CTransaction> *)&blockWitness,&mtx);
      auVar8 = local_138;
      _Var9._M_pi = _Stack_130._M_pi;
      _local_138 = (undefined1  [16])0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         local_58._0_8_)->_M_ptr + lVar10);
      puVar1 = (undefined8 *)(local_58._0_8_ + lVar10 + -8);
      *puVar1 = auVar8;
      puVar1[1] = _Var9._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx.vin);
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x10;
    } while (uVar11 < (ulong)(CONCAT53(local_58._11_5_,local_58._8_3_) - local_58._0_8_ >> 4));
  }
  BlockWitnessMerkleRoot(&blockWitness,(CBlock *)local_a8,(bool *)0x0);
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            (&hashes,CONCAT53(local_58._11_5_,local_58._8_3_) - local_58._0_8_ >> 4);
  pbVar7 = &(hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start)->super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[0x10] = '\0';
  (pbVar7->m_data)._M_elems[0x11] = '\0';
  (pbVar7->m_data)._M_elems[0x12] = '\0';
  (pbVar7->m_data)._M_elems[0x13] = '\0';
  (pbVar7->m_data)._M_elems[0x14] = '\0';
  (pbVar7->m_data)._M_elems[0x15] = '\0';
  (pbVar7->m_data)._M_elems[0x16] = '\0';
  (pbVar7->m_data)._M_elems[0x17] = '\0';
  (pbVar7->m_data)._M_elems[0x18] = '\0';
  (pbVar7->m_data)._M_elems[0x19] = '\0';
  (pbVar7->m_data)._M_elems[0x1a] = '\0';
  (pbVar7->m_data)._M_elems[0x1b] = '\0';
  (pbVar7->m_data)._M_elems[0x1c] = '\0';
  (pbVar7->m_data)._M_elems[0x1d] = '\0';
  (pbVar7->m_data)._M_elems[0x1e] = '\0';
  (pbVar7->m_data)._M_elems[0x1f] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  ((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  peVar2 = (((pointer)(local_58._0_8_ + 0x10))->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar3 = *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)
           ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   (hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start[1].super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   (hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start[1].super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  *(undefined8 *)
   hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start[1].super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)
   (hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start[1].super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  std::vector<uint256,_std::allocator<uint256>_>::vector(&local_1b0,&hashes);
  hashes_00.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffe10;
  hashes_00.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffe08;
  hashes_00.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = in_stack_fffffffffffffe18;
  hashes_00.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = in_stack_fffffffffffffe19;
  ComputeMerkleRoot(&merkleRootofHashes,hashes_00,(bool *)&local_1b0);
  if (local_1b0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x15e;
  file.m_begin = (iterator)&local_1c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d0,msg);
  auVar13[0] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0]);
  auVar13[1] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[1] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[1]);
  auVar13[2] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[2] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[2]);
  auVar13[3] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[3] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[3]);
  auVar13[4] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[4] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[4]);
  auVar13[5] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[5] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[5]);
  auVar13[6] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[6] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[6]);
  auVar13[7] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[7] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[7]);
  auVar13[8] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[8] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[8]);
  auVar13[9] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[9] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[9]);
  auVar13[10] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[10] ==
                 merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[10]);
  auVar13[0xb] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar13[0xc] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar13[0xd] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar13[0xe] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar13[0xf] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar12[0] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x10] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar12[1] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x11] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar12[2] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x12] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar12[3] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x13] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar12[4] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x14] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar12[5] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x15] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar12[6] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x16] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar12[7] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x17] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar12[8] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x18] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar12[9] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x19] ==
                merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar12[10] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar12[0xb] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar12[0xc] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar12[0xd] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar12[0xe] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar12[0xf] = -(blockWitness.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  merkleRootofHashes.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar12 = auVar12 & auVar13;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_110[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
                         + 0x5e);
  mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_118;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013aed38;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_140;
  _Stack_130._M_pi._0_1_ = 0;
  local_138 = (undefined1  [8])&PTR__lazy_ostream_013aed38;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_140 = &blockWitness;
  local_118 = (undefined1  [8])&merkleRootofHashes;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&stack0xfffffffffffffe10,1,2,REQUIRE,0xea8c0e,
             (size_t)local_110,0x15e,&mtx,"blockWitness",local_138);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  if (hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_BlockWitness)
{
    CBlock block;

    block.vtx.resize(2);
    for (std::size_t pos = 0; pos < block.vtx.size(); pos++) {
        CMutableTransaction mtx;
        mtx.nLockTime = pos;
        block.vtx[pos] = MakeTransactionRef(std::move(mtx));
    }

    uint256 blockWitness = BlockWitnessMerkleRoot(block);

    std::vector<uint256> hashes;
    hashes.resize(block.vtx.size());
    hashes[0].SetNull();
    hashes[1] = block.vtx[1]->GetHash();

    uint256 merkleRootofHashes = ComputeMerkleRoot(hashes);

    BOOST_CHECK_EQUAL(merkleRootofHashes, blockWitness);
}